

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sens.c
# Opt level: O0

void sensmassage(int type,Item *qfun,int fn)

{
  long lVar1;
  Symbol *pSVar2;
  Item *pIVar3;
  List *pLVar4;
  Symbol *pSVar5;
  uint in_EDX;
  long in_RSI;
  int in_EDI;
  int iVar6;
  Symbol *s;
  Symbol *newfun;
  Symbol *oldfun;
  List *senstmt;
  Item *q1;
  Item *q;
  char dname [100];
  char sname [100];
  int newjac;
  int j;
  int i;
  int nstate;
  char *in_stack_00001e98;
  char *in_stack_00001ea0;
  char *in_stack_00001ea8;
  int in_stack_00001eb4;
  Symbol *in_stack_00001eb8;
  int in_stack_00001ec4;
  Item *in_stack_00001ed0;
  int in_stack_00001ed8;
  char *in_stack_00001ee0;
  Symbol *in_stack_fffffffffffffe78;
  undefined4 uVar7;
  char *s_00;
  List *in_stack_fffffffffffffe80;
  undefined4 uVar8;
  uint uVar9;
  List *in_stack_fffffffffffffe88;
  undefined4 uVar10;
  int iVar11;
  uint in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Symbol *local_148;
  Item *local_128;
  Item *local_120;
  List local_118 [3];
  char local_a8 [100];
  undefined4 local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  long local_30;
  int local_24;
  
  lVar1 = *(long *)(in_RSI + 8);
  local_34 = in_EDX;
  local_30 = in_RSI;
  local_24 = in_EDI;
  sprintf(buf,"S_%s",*(undefined8 *)(lVar1 + 0x48));
  pSVar2 = lookup((char *)in_stack_fffffffffffffe78);
  if (pSVar2 != (Symbol *)0x0) {
    diag((char *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
  }
  pSVar2 = install((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  pSVar2->subtype = *(long *)(lVar1 + 8);
  (pSVar2->u).i = *(int *)(lVar1 + 0x28);
  pSVar2->used = *(int *)(lVar1 + 0x30);
  local_38 = *(uint *)(lVar1 + 0x30);
  if (local_24 == 0x10a) {
    *(int *)(lVar1 + 0x30) = (sens_parm + 1) * *(int *)(lVar1 + 0x30);
  }
  if (sensinfo == (List *)0x0) {
    sensinfo = newlist();
  }
  lappendsym(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pIVar3 = lappendsym(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pLVar4 = newlist();
  (pIVar3->element).lst = pLVar4;
  *(Symbol **)(local_30 + 8) = pSVar2;
  sprintf(buf,"\nstatic int %s() {\n",*(undefined8 *)(lVar1 + 0x48));
  lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
  sprintf(buf,"\nstatic int %s();\n",pSVar2->name);
  linsertstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
  local_44 = 1;
  local_3c = 1;
  local_120 = parmlist->next;
  do {
    if (local_120 == parmlist) {
      sprintf(buf,"static int _eplist%d[%d], _emlist%d[%d];\n",(ulong)local_34,
              (ulong)(local_38 * sens_parm),(ulong)local_34,(ulong)(local_38 * sens_parm));
      linsertstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      local_3c = 0;
      for (local_120 = parmlist->next; local_120 != parmlist; local_120 = local_120->next) {
        iVar6 = local_38 * local_3c;
        in_stack_fffffffffffffe78 =
             (Symbol *)CONCAT44((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),local_34);
        in_stack_fffffffffffffe80 =
             (List *)CONCAT44((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                              local_38 * (local_3c + 1));
        in_stack_fffffffffffffe88 =
             (List *)CONCAT44((int)((ulong)in_stack_fffffffffffffe88 >> 0x20),local_34);
        sprintf(buf,
                "envelope(_p, _slist%d, %d, %s, U_%s,_slist%d+%d, _eplist%d + %d, _emlist%d + %d);\n"
                ,(ulong)local_34,(ulong)local_38,((local_120->element).sym)->name,
                ((local_120->element).sym)->name);
        lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        sprintf(buf,"U_%s",((local_120->element).sym)->name);
        ifnew_parminstall((char *)CONCAT44(in_stack_fffffffffffffe94,iVar6),
                          (char *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78);
        for (local_128 = statelist->next; iVar11 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
            local_128 != statelist; local_128 = local_128->next) {
          local_40 = ((local_128->element).sym)->varnum;
          sprintf(local_a8,"EP_%s_%s",((local_128->element).sym)->name,
                  ((local_120->element).sym)->name);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
          sprintf((char *)local_118,"EM_%s_%s",((local_128->element).sym)->name,
                  ((local_120->element).sym)->name);
          local_148 = lookup((char *)in_stack_fffffffffffffe78);
          if (local_148 == (Symbol *)0x0) {
            local_148 = install((char *)CONCAT44(in_stack_fffffffffffffe94,iVar6),iVar11);
          }
          if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
            s_00 = (char *)0x0;
            iVar11 = 0;
            depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                       in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                       in_stack_00001ee0);
          }
          else {
            s_00 = (char *)0x0;
            iVar11 = 0;
            depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                       in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                       in_stack_00001ee0);
          }
          local_148->usage = local_148->usage | 8;
          local_148 = lookup(s_00);
          if (local_148 == (Symbol *)0x0) {
            local_148 = install((char *)CONCAT44(in_stack_fffffffffffffe94,iVar6),iVar11);
          }
          if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
            uVar7 = 0;
            in_stack_fffffffffffffe88 = (List *)0x0;
            depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                       in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                       in_stack_00001ee0);
          }
          else {
            uVar7 = 0;
            in_stack_fffffffffffffe88 = (List *)0x0;
            depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                       in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                       in_stack_00001ee0);
          }
          local_148->usage = local_148->usage | 8;
          if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
            in_stack_fffffffffffffe80 = local_118;
            in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar7,local_40 + local_38 * local_3c);
            sprintf(buf,"_eplist%d[%d] = &(%s) - _p; _emlist%d[%d] = &(%s) - _p;\n",(ulong)local_34,
                    (ulong)(local_40 + local_38 * local_3c),local_a8,(ulong)local_34);
          }
          else {
            in_stack_fffffffffffffe88 = local_118;
            in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar7,local_34);
            in_stack_fffffffffffffe80 = (List *)CONCAT44(uVar10,local_40 + local_38 * local_3c);
            sprintf(buf,
                    "for (_i=0;_i<%d;_i++){_eplist%d[%d+_i] = (%s + _i) - _p; _emlist%d[%d+_i] = (%s + _i) - _p;}\n"
                    ,(ulong)(uint)((local_128->element).sym)->araydim,(ulong)local_34,
                    (ulong)(local_40 + local_38 * local_3c),local_a8);
          }
          lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        }
        local_3c = local_3c + 1;
      }
      if (local_24 == 0x10a) {
        sprintf(buf,"return %s();\n}\n",pSVar2->name);
      }
      else {
        sprintf(buf,"%s();\n}\n",pSVar2->name);
      }
      lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      freelist((List **)in_stack_fffffffffffffe80);
      freelist((List **)in_stack_fffffffffffffe80);
      sens_parm = 0;
      return;
    }
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (local_24 == 0x10a) {
      in_stack_fffffffffffffe78 = (Symbol *)pSVar2->name;
      in_stack_fffffffffffffe80 = (List *)indepsym->name;
      in_stack_fffffffffffffe88 = (List *)CONCAT44(uVar10,local_44);
      in_stack_fffffffffffffe90 = local_34;
      sprintf(buf,
              "error=trajecsens(%d, _slist%d, _dlist%d,_p, &%s, %s, %s, %d, _slist%d+%d, _dlist%d+%d);\n if(error){abort_run(error);}\n"
              ,(ulong)local_38,(ulong)local_34,(ulong)local_34,((local_120->element).sym)->name);
      lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    }
    else {
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      if (local_24 == 0x126) {
        in_stack_fffffffffffffe90 = local_38 * local_3c;
        in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar7,local_34);
        in_stack_fffffffffffffe80 = (List *)CONCAT44(uVar8,local_44);
        in_stack_fffffffffffffe88 = (List *)CONCAT44(uVar10,local_34);
        sprintf(buf,
                "error=steadysens(%d, _slist%d, _p, &%s, %s, _dlist%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n"
                ,(ulong)local_38,(ulong)local_34,((local_120->element).sym)->name,pSVar2->name);
        lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      }
      else if (local_24 == 0x125) {
        in_stack_fffffffffffffe90 = local_38 * local_3c;
        in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar7,local_34);
        in_stack_fffffffffffffe80 = (List *)CONCAT44(uVar8,local_44);
        in_stack_fffffffffffffe88 = (List *)CONCAT44(uVar10,local_34);
        sprintf(buf,
                "error=linearsens(%d, _slist%d, _p, &%s, %s, _coef%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n"
                ,(ulong)local_38,(ulong)local_34,((local_120->element).sym)->name,pSVar2->name);
        lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      }
    }
    local_44 = 0;
    for (local_128 = statelist->next; iVar6 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
        local_128 != statelist; local_128 = local_128->next) {
      local_40 = ((local_128->element).sym)->varnum;
      sprintf(local_a8,"S_%s_%s",((local_128->element).sym)->name,((local_120->element).sym)->name);
      uVar9 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      sprintf((char *)local_118,"D%s",local_a8);
      local_148 = lookup((char *)in_stack_fffffffffffffe78);
      if (local_148 == (Symbol *)0x0) {
        local_148 = install((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            iVar6);
      }
      if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
        in_stack_fffffffffffffe78 = (Symbol *)0x0;
        in_stack_fffffffffffffe80 = (List *)((ulong)uVar9 << 0x20);
        in_stack_fffffffffffffe88 = (List *)0x0;
        depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                   in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                   in_stack_00001ee0);
      }
      else {
        in_stack_fffffffffffffe78 = (Symbol *)0x0;
        in_stack_fffffffffffffe80 = (List *)((ulong)uVar9 << 0x20);
        in_stack_fffffffffffffe88 = (List *)0x0;
        depinstall(in_stack_00001ec4,in_stack_00001eb8,in_stack_00001eb4,in_stack_00001ea8,
                   in_stack_00001ea0,in_stack_00001e98,in_stack_00001ed0,in_stack_00001ed8,
                   in_stack_00001ee0);
      }
      local_148->usage = local_148->usage | 8;
      if (local_24 == 0x10a) {
        pSVar5 = lookup((char *)in_stack_fffffffffffffe78);
        if (pSVar5 == (Symbol *)0x0) {
          __assert_fail("s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/sens.c"
                        ,0x10e,"void sensmassage()");
        }
        pSVar5->usage = pSVar5->usage | 8;
        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
          in_stack_fffffffffffffe80 = local_118;
          in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar10,local_40 + local_38 * local_3c);
          sprintf(buf,"_slist%d[%d] = &(%s) - _p; _dlist%d[%d] = &(%s) - _p;\n",(ulong)local_34,
                  (ulong)(local_40 + local_38 * local_3c),local_a8,(ulong)local_34);
        }
        else {
          in_stack_fffffffffffffe88 = local_118;
          in_stack_fffffffffffffe78 = (Symbol *)CONCAT44(uVar10,local_34);
          in_stack_fffffffffffffe80 =
               (List *)CONCAT44((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                                local_40 + local_38 * local_3c);
          sprintf(buf,
                  "for (_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p; _dlist%d[%d+_i] = (%s + _i) - _p;}\n"
                  ,(ulong)(uint)((local_128->element).sym)->araydim,(ulong)local_34,
                  (ulong)(local_40 + local_38 * local_3c),local_a8);
        }
      }
      else if ((local_24 == 0x126) || (local_24 == 0x125)) {
        if ((((local_128->element).sym)->subtype & 0x20U) == 0) {
          sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)local_34,
                  (ulong)(local_40 + local_38 * local_3c),local_a8);
        }
        else {
          sprintf(buf,"for (_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",
                  (ulong)(uint)((local_128->element).sym)->araydim,(ulong)local_34,
                  (ulong)(local_40 + local_38 * local_3c),local_a8);
        }
      }
      lappendstr(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    }
    local_3c = local_3c + 1;
    local_120 = local_120->next;
  } while( true );
}

Assistant:

void sensmassage(type, qfun, fn)
	int type;
	Item *qfun;
	int fn;
{
/*qfun is the list symbol for the name of the derivative block. It has
a count of the number of state variables used.  A copy of this symbol
is made but with the name S_name and qfun is made to point to the new symbol
The old function name is then the name of a new created function which
contains the calls to trajecsens followed by a call to S_name to compute the
Note that trajecsens itself contains calls to S_name.
qfun->sym->used is then multiplied by the (1 + #sens parms used) so that
the solve code doesn't need to be changed.

The slist needs to be augmented and that is done here also. However
since it is declared in solve.c it is necessary to access the number
of parameters being used.
*/

/* extending to nonlinear blocks. Differences:
Number of states remains the same. Statements built here but saved for output
when SOLVE is translated. No derivative variables constructed.
However, the full dlist is constructed since we need the last part
for use by EM variables
This has gotten much more difficult to understand since the nonlinear method
is merged into the code to take advantage of common code.  It would be
conceptually simpler to merely repeat the whole process in a separate file*/
/* extending to linear blocks. Same as nonlinear except that
there is a linearsens call and we must be sure to keep proper state order */
	int nstate, i, j, newjac;
	char sname[100], dname[100];
	Item *q, *q1;
	List *senstmt;	/* nonlinear sens statements (saved in sensinfo) */
	Symbol *oldfun, *newfun, *s;
	
	oldfun = SYM(qfun);
	Sprintf(buf, "S_%s", oldfun->name);
	if (lookup(buf)) {
		diag(buf, " is user defined and cant be used for SENS");
	}
	/*this is a time bomb*/
	newfun = install(buf, oldfun->type);
	newfun->subtype = oldfun->subtype;
	newfun->u.i = oldfun->u.i; /*the listnum*/
	newfun->used = oldfun->used; /*number of states*/
	nstate = oldfun->used;
	if (type == DERIVATIVE) {
		oldfun->used *= (1 + sens_parm);
	}
/* even derivatives need sensinfo since envelope statements go after the
SOLVE for statement */
	if (!sensinfo) {
		sensinfo = newlist();
	}
	Lappendsym(sensinfo, oldfun); /* newton will call oldfun
		which will merely call newfun */
	q = lappendsym(sensinfo, SYM0); /* the second element is a list
		of statements to be constructed below */
	senstmt = newlist();
	LST(q) = senstmt;

	SYM(qfun) = newfun; /* the derivative equations alone are now
				called newfun->name; oldfun will contain
				the trajecsens calls */

	/* build the oldfun function */
	/* In the nonlinear case all statements except call to newfun get
		sent to senstmt */
	/* in the derivative case envelope statements get sent to senstmt */
	Sprintf(buf, "\nstatic int %s() {\n", oldfun->name);
	Lappendstr(procfunc, buf);
	Sprintf(buf, "\nstatic int %s();\n", newfun->name);
	Linsertstr(procfunc, buf);
	newjac = 1;
	i=1;
	ITERATE(q, parmlist) {

if (type == DERIVATIVE) {
		Sprintf(buf, "error=trajecsens(%d, _slist%d, _dlist%d,\
_p, &%s, %s, %s, %d, _slist%d+%d, _dlist%d+%d);\n if(error){abort_run(error);}\n",
nstate,
fn, fn,
SYM(q)->name, newfun->name, indepsym->name, newjac,
fn, nstate*i,
fn, nstate*i);
		Lappendstr(procfunc, buf);
}else if (type == NONLINEAR) {
		Sprintf(buf, "error=steadysens(%d, _slist%d, _p, &%s, %s,\
 _dlist%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n",
			nstate,
			fn,
			SYM(q)->name, newfun->name, fn, newjac,
			fn, nstate*i);
		Lappendstr(senstmt, buf);
}else if (type == LINEAR) {
		Sprintf(buf, "error=linearsens(%d, _slist%d, _p, &%s, %s,\
 _coef%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n",
			nstate,
			fn,
			SYM(q)->name, newfun->name, fn, newjac,
			fn, nstate*i);
		Lappendstr(senstmt, buf);
}
		newjac = 0;
		/* define S_state_parm and DS_state_parm */
		ITERATE(q1, statelist) {
			j = SYM(q1)->varnum;
			Sprintf(sname, "S_%s_%s", SYM(q1)->name, SYM(q)->name);
			Sprintf(dname, "D%s", sname);
			if ((s = lookup(sname)) == SYM0) {
				s = install(sname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(1, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(1, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;
if (type == DERIVATIVE) {
			s = lookup(dname);
			assert (s);
			s->usage |= DEP;
			/* initialize augmented _slist and _dlist */
			if (SYM(q1)->subtype & ARRAY) {
Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_slist%d[%d+_i] = (%s + _i) - _p; _dlist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}else{
Sprintf(buf, "_slist%d[%d] = &(%s) - _p; _dlist%d[%d] = &(%s) - _p;\n",
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}
}else if (type == NONLINEAR || type == LINEAR) {
			if (SYM(q1)->subtype & ARRAY) {
				Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_slist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
					fn, j + nstate*i, sname);
			}else{
				Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
					fn, j + nstate*i, sname);
			}
}
			Lappendstr(initlist, buf);
		}
		i++;
	}

/* addition of envelope calls by modifying copy of above code
 create EP_state_parm, EM_state_parm using a new eplist and emlist
 respectively.  Also create U_parm with default value of .05 if it
 doesn't already exist as a constant.
 */
 
Sprintf(buf, "static int _eplist%d[%d], _emlist%d[%d];\n",
   fn, nstate*sens_parm, fn, nstate*sens_parm);
   	Linsertstr(procfunc, buf);
   	i = 0;
	ITERATE(q, parmlist) {

		Sprintf(buf, "envelope(_p, _slist%d, %d, %s, U_%s,\
_slist%d+%d, _eplist%d + %d, _emlist%d + %d);\n",
fn, nstate,
SYM(q)->name, SYM(q)->name,
fn, nstate*(1 + i),
fn, nstate*i,
fn, nstate*i);
		Lappendstr(senstmt, buf);

		/* define the uncertainty variables */
		Sprintf(buf, "U_%s", SYM(q)->name);
		IGNORE(ifnew_parminstall(buf, "0.05", "", ""));
		/* define EP_state_parm and EM_state_parm */
		ITERATE(q1, statelist) {
			j = SYM(q1)->varnum;
			Sprintf(sname, "EP_%s_%s", SYM(q1)->name, SYM(q)->name);
			Sprintf(dname, "EM_%s_%s", SYM(q1)->name, SYM(q)->name);
			if ((s = lookup(sname)) == SYM0) {
				s = install(sname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(0, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(0, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;

			if ((s = lookup(dname)) == SYM0) {
				s = install(dname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(0, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(0, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;

			/* initialize augmented _slist and _dlist */
			if (SYM(q1)->subtype & ARRAY) {
Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_eplist%d[%d+_i] = (%s + _i) - _p; _emlist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}else{
Sprintf(buf, "_eplist%d[%d] = &(%s) - _p; _emlist%d[%d] = &(%s) - _p;\n",
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}
			Lappendstr(initlist, buf);
		}
		i++;
	}
	if (type == DERIVATIVE) {
		Sprintf(buf, "return %s();\n}\n", newfun->name);
	}else{
		Sprintf(buf, "%s();\n}\n", newfun->name);
	}
	Lappendstr(procfunc, buf);
	freelist(&parmlist);
	freelist(&statelist);
	sens_parm = 0;
}